

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_hmac.c
# Opt level: O0

void rekey(uint8_t *key,uint8_t *new_key,uint key_size)

{
  uint local_24;
  uint i;
  uint8_t outer_pad;
  uint8_t inner_pad;
  uint key_size_local;
  uint8_t *new_key_local;
  uint8_t *key_local;
  
  for (local_24 = 0; local_24 < key_size; local_24 = local_24 + 1) {
    key[local_24] = new_key[local_24] ^ 0x36;
    key[local_24 + 0x40] = new_key[local_24] ^ 0x5c;
  }
  for (; local_24 < 0x40; local_24 = local_24 + 1) {
    key[local_24] = '6';
    key[local_24 + 0x40] = '\\';
  }
  return;
}

Assistant:

static void rekey(uint8_t *key, const uint8_t *new_key, unsigned int key_size)
{
	const uint8_t inner_pad = (uint8_t) 0x36;
	const uint8_t outer_pad = (uint8_t) 0x5c;
	unsigned int i;

	for (i = 0; i < key_size; ++i) {
		key[i] = inner_pad ^ new_key[i];
		key[i + TC_SHA256_BLOCK_SIZE] = outer_pad ^ new_key[i];
	}
	for (; i < TC_SHA256_BLOCK_SIZE; ++i) {
		key[i] = inner_pad; key[i + TC_SHA256_BLOCK_SIZE] = outer_pad;
	}
}